

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::DebuggerScope::EnsurePropertyListIsAllocated(DebuggerScope *this)

{
  Type pRVar1;
  Recycler *alloc;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if ((this->scopeProperties).ptr !=
      (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    return;
  }
  local_50 = (undefined1  [8])
             &JsUtil::
              List<Js::DebuggerScopeProperty,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x1748;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  pLVar2 = (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)new<Memory::Recycler>(0x30,alloc,0x38bbb2);
  pRVar1 = this->recycler;
  (pLVar2->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).buffer.
  ptr = (DebuggerScopeProperty *)0x0;
  (pLVar2->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).count =
       0;
  (pLVar2->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).alloc =
       pRVar1;
  (pLVar2->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f06d0;
  pLVar2->length = 0;
  pLVar2->increment = 4;
  Memory::Recycler::WBSetBit((char *)&this->scopeProperties);
  (this->scopeProperties).ptr = pLVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->scopeProperties);
  return;
}

Assistant:

void DebuggerScope::EnsurePropertyListIsAllocated()
    {
        if (this->scopeProperties == nullptr)
        {
            this->scopeProperties = RecyclerNew(this->recycler, DebuggerScopePropertyList, this->recycler);
        }
    }